

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::SlabAllocatorBase<8>::UnlinkAllocation(SlabAllocatorBase<8> *this,void *allocation)

{
  long lVar1;
  SlabBlock *obj;
  SlabBlock *block;
  LargeSlabBlock *largeBlock;
  ptrdiff_t offset;
  byte *realBase;
  void *allocation_local;
  SlabAllocatorBase<8> *this_local;
  
  if (this->m_reserveActiveBytes != 0) {
    TTDAbort_unrecoverable_error("We don\'t have anything reserved.");
  }
  lVar1 = *(long *)((long)allocation + -8);
  if (lVar1 == 0) {
    if ((LargeSlabBlock *)((long)allocation + -0x28) == this->m_largeBlockList) {
      if (*(long *)((long)allocation + -0x10) != 0) {
        TTDAbort_unrecoverable_error("Should always have a null next at head");
      }
      this->m_largeBlockList = this->m_largeBlockList->Previous;
      if (this->m_largeBlockList != (LargeSlabBlock *)0x0) {
        this->m_largeBlockList->Next = (LargeSlabBlock *)0x0;
      }
    }
    else {
      if (*(long *)((long)allocation + -0x10) != 0) {
        *(undefined8 *)(*(long *)((long)allocation + -0x10) + 0x10) =
             *(undefined8 *)((long)allocation + -0x18);
      }
      if (*(long *)((long)allocation + -0x18) != 0) {
        *(undefined8 *)(*(long *)((long)allocation + -0x18) + 0x18) =
             *(undefined8 *)((long)allocation + -0x10);
      }
    }
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)*(uint *)((long)allocation + -0x20),
               (uchar *)((long)allocation + -0x28));
  }
  else {
    obj = (SlabBlock *)(((long)allocation + -8) - lVar1);
    obj->RefCounter = obj->RefCounter + -1;
    if (obj->RefCounter == 0) {
      if (obj == this->m_headBlock) {
        this->m_currPos = this->m_headBlock->BlockData;
        this->m_endPos = this->m_headBlock->BlockData + ((ulong)this->m_slabBlockSize - 0x20);
        memset(this->m_currPos,0,(ulong)this->m_slabBlockSize - 0x20);
        this->m_headBlock->RefCounter = 0;
      }
      else {
        if (obj->Next != (SlabBlock *)0x0) {
          obj->Next->Previous = obj->Previous;
        }
        if (obj->Previous != (SlabBlock *)0x0) {
          obj->Previous->Next = obj->Next;
        }
        Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                  (&Memory::HeapAllocator::Instance,(ulong)this->m_slabBlockSize,(uchar *)obj);
      }
    }
  }
  return;
}

Assistant:

void UnlinkAllocation(const void* allocation)
        {
            TTDAssert(canUnlink != 0, "Unlink not allowed with this slab allocator.");
            TTDAssert(this->m_reserveActiveBytes == 0, "We don't have anything reserved.");

            //get the meta-data for this allocation and see if it is a
            byte* realBase = ((byte*)allocation) - canUnlink;
            ptrdiff_t offset = *((ptrdiff_t*)realBase);

            if (offset == 0)
            {
                //it is a large allocation just free it
                LargeSlabBlock* largeBlock = (LargeSlabBlock*)(((byte*)allocation) - TTD_LARGE_SLAB_BLOCK_SIZE);

                if (largeBlock == this->m_largeBlockList)
                {
                    TTDAssert(largeBlock->Next == nullptr, "Should always have a null next at head");

                    this->m_largeBlockList = this->m_largeBlockList->Previous;
                    if (this->m_largeBlockList != nullptr)
                    {
                        this->m_largeBlockList->Next = nullptr;
                    }
                }
                else
                {
                    if (largeBlock->Next != nullptr)
                    {
                        largeBlock->Next->Previous = largeBlock->Previous;
                    }

                    if (largeBlock->Previous != nullptr)
                    {
                        largeBlock->Previous->Next = largeBlock->Next;
                    }
                }

                TT_HEAP_FREE_ARRAY(byte, (byte*)largeBlock, largeBlock->TotalBlockSize);
            }
            else
            {
                //lookup the slab block and do ref counting
                SlabBlock* block = (SlabBlock*)(realBase - offset);

                block->RefCounter--;
                if (block->RefCounter == 0)
                {
                    if (block == this->m_headBlock)
                    {
                        //we always need a head block to allocate out of -- so instead of deleting just reset it
                        this->m_currPos = this->m_headBlock->BlockData;
                        this->m_endPos = this->m_headBlock->BlockData + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

                        memset(this->m_currPos, 0, TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize));

                        this->m_headBlock->RefCounter = 0;
                    }
                    else
                    {
                        if (block->Next != nullptr)
                        {
                            block->Next->Previous = block->Previous;
                        }

                        if (block->Previous != nullptr)
                        {
                            block->Previous->Next = block->Next;
                        }

                        TT_HEAP_FREE_ARRAY(byte, (byte*)block, this->m_slabBlockSize);
                    }
                }
            }
        }